

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fStencilTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::StencilShader::~StencilShader(StencilShader *this)

{
  sglr::ShaderProgram::~ShaderProgram(&this->super_ShaderProgram);
  operator_delete(this,0x160);
  return;
}

Assistant:

StencilShader (void)
		: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
									<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
									<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
									<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
									<< sglr::pdec::Uniform("u_color", glu::TYPE_FLOAT_VEC4)
									<< sglr::pdec::VertexSource("#version 300 es\n"
																"in highp vec4 a_position;\n"
																"void main (void)\n"
																"{\n"
																"	gl_Position = a_position;\n"
																"}\n")
									<< sglr::pdec::FragmentSource("#version 300 es\n"
																  "uniform highp vec4 u_color;\n"
																  "layout(location = 0) out mediump vec4 o_color;\n"
																  "void main (void)\n"
																  "{\n"
																  "	o_color = u_color;\n"
																  "}\n"))
		, u_color	(getUniformByName("u_color"))
	{
	}